

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall google::protobuf::MapKey::SetType(MapKey *this,CppType type)

{
  string *psVar1;
  
  if (this->type_ != type) {
    if (this->type_ == CPPTYPE_STRING) {
      psVar1 = (this->val_).string_value_;
      if (psVar1 != (string *)0x0) {
        std::__cxx11::string::~string((string *)psVar1);
      }
      operator_delete(psVar1,0x20);
    }
    this->type_ = type;
    if (type == CPPTYPE_STRING) {
      psVar1 = (string *)operator_new(0x20);
      (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
      psVar1->_M_string_length = 0;
      (psVar1->field_2)._M_local_buf[0] = '\0';
      (this->val_).string_value_ = psVar1;
    }
  }
  return;
}

Assistant:

void SetType(FieldDescriptor::CppType type) {
    if (type_ == type) return;
    if (type_ == FieldDescriptor::CPPTYPE_STRING) {
      delete val_.string_value_;
    }
    type_ = type;
    if (type_ == FieldDescriptor::CPPTYPE_STRING) {
      val_.string_value_ = new string;
    }
  }